

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderIndexingTests.cpp
# Opt level: O1

void deqp::gles2::Functional::evalSubscriptVec3(ShaderEvalContext *c)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int i;
  long lVar4;
  int local_28 [7];
  float afStack_c [3];
  
  fVar1 = (c->coords).m_data[1];
  fVar2 = (c->coords).m_data[2];
  fVar3 = (c->coords).m_data[0];
  lVar4 = 0;
  do {
    afStack_c[lVar4] = fVar2 * 0.25 + fVar1 * 0.5 + fVar3;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_28[2] = 0;
  local_28[3] = 1;
  local_28[4] = 2;
  lVar4 = 2;
  do {
    (c->color).m_data[local_28[lVar4]] = afStack_c[lVar4 + -2];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  return;
}

Assistant:

void evalSubscriptVec3 (ShaderEvalContext& c) { c.color.xyz() = Vec3(c.coords.x() + 0.5f*c.coords.y() + 0.25f*c.coords.z()); }